

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockingPriorityQueue.hpp
# Opt level: O0

void __thiscall
gmlc::containers::BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>
::push<helics::action_message_def::action_t>
          (BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this,
          action_t *val)

{
  bool bVar1;
  value_type *__x;
  long in_RDI;
  unique_lock<std::mutex> pullLock;
  bool expEmpty;
  unique_lock<std::mutex> pushLock;
  value_type *in_stack_fffffffffffffca8;
  ActionMessage *in_stack_fffffffffffffcb0;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *in_stack_fffffffffffffcc0;
  action_t startingAction;
  ActionMessage *in_stack_fffffffffffffcd0;
  memory_order in_stack_fffffffffffffcf8;
  undefined1 in_stack_fffffffffffffcff;
  bool *in_stack_fffffffffffffd00;
  atomic<bool> *in_stack_fffffffffffffd08;
  
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)in_stack_fffffffffffffcb0,
             (mutex_type *)in_stack_fffffffffffffca8);
  bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                    (in_stack_fffffffffffffcc0);
  if (bVar1) {
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                       (bool)in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8);
    if (bVar1) {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_fffffffffffffcb0);
      startingAction = (action_t)((ulong)in_RDI >> 0x20);
      std::unique_lock<std::mutex>::unique_lock
                ((unique_lock<std::mutex> *)in_stack_fffffffffffffcb0,
                 (mutex_type *)in_stack_fffffffffffffca8);
      std::atomic<bool>::operator=
                ((atomic<bool> *)in_stack_fffffffffffffcb0,
                 SUB81((ulong)in_stack_fffffffffffffca8 >> 0x38,0));
      bVar1 = std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::empty
                        (in_stack_fffffffffffffcc0);
      if (bVar1) {
        helics::ActionMessage::ActionMessage(in_stack_fffffffffffffcd0,startingAction);
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        helics::ActionMessage::~ActionMessage(in_stack_fffffffffffffcb0);
      }
      else {
        std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)in_stack_fffffffffffffcb0);
        helics::ActionMessage::ActionMessage(in_stack_fffffffffffffcd0,startingAction);
        std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                  ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
        helics::ActionMessage::~ActionMessage(in_stack_fffffffffffffcb0);
      }
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock
                ((unique_lock<std::mutex> *)in_stack_fffffffffffffcb0);
    }
    else {
      in_stack_fffffffffffffcb0 = (ActionMessage *)(in_RDI + 0x50);
      helics::ActionMessage::ActionMessage
                (in_stack_fffffffffffffcd0,(action_t)((ulong)in_RDI >> 0x20));
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                 in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
      helics::ActionMessage::~ActionMessage(in_stack_fffffffffffffcb0);
      bVar1 = std::atomic<bool>::compare_exchange_strong
                        (in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,
                         (bool)in_stack_fffffffffffffcff,in_stack_fffffffffffffcf8);
      if (bVar1) {
        std::condition_variable::notify_all();
      }
    }
  }
  else {
    __x = (value_type *)(in_RDI + 0x50);
    helics::ActionMessage::ActionMessage
              (in_stack_fffffffffffffcd0,(action_t)((ulong)in_RDI >> 0x20));
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
               in_stack_fffffffffffffcb0,__x);
    helics::ActionMessage::~ActionMessage(in_stack_fffffffffffffcb0);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffcb0);
  return;
}

Assistant:

void push(Z&& val)  // forwarding reference
        {
            std::unique_lock<MUTEX> pushLock(
                m_pushLock);  // only one lock on this branch
            if (pushElements.empty()) {
                bool expEmpty = true;
                if (queueEmptyFlag.compare_exchange_strong(expEmpty, false)) {
                    // release the push lock so we don't get a potential
                    // deadlock condition
                    pushLock.unlock();
                    std::unique_lock<MUTEX> pullLock(
                        m_pullLock);  // first pullLock
                    queueEmptyFlag = false;
                    if (pullElements.empty()) {
                        pullElements.push_back(std::forward<Z>(val));
                        // pullLock.unlock ();
                    } else {
                        pushLock.lock();
                        pushElements.push_back(std::forward<Z>(val));
                    }
                    condition.notify_all();
                    return;
                } else {
                    pushElements.push_back(std::forward<Z>(val));
                    expEmpty = true;
                    if (queueEmptyFlag.compare_exchange_strong(
                            expEmpty, false)) {
                        condition.notify_all();
                    }
                    return;
                }
            }
            pushElements.push_back(std::forward<Z>(val));
        }